

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Vector<kj::_::CidrRange>::~Vector(Vector<kj::_::CidrRange> *this)

{
  CidrRange *pCVar1;
  RemoveConst<kj::_::CidrRange> *pRVar2;
  CidrRange *pCVar3;
  ArrayDisposer *pAVar4;
  
  pCVar1 = (this->builder).ptr;
  if (pCVar1 != (CidrRange *)0x0) {
    pRVar2 = (this->builder).pos;
    pCVar3 = (this->builder).endPtr;
    (this->builder).ptr = (CidrRange *)0x0;
    (this->builder).pos = (RemoveConst<kj::_::CidrRange> *)0x0;
    (this->builder).endPtr = (CidrRange *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pCVar1,0x18,((long)pRVar2 - (long)pCVar1 >> 3) * -0x5555555555555555,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }